

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

bool flatbuffers::GenerateGoGRPC(Parser *parser,string *path,string *file_name)

{
  bool bVar1;
  pointer ppSVar2;
  int iVar3;
  GoGRPCGenerator local_a0;
  
  iVar3 = 0;
  for (ppSVar2 = (parser->services_).vec.
                 super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar2 !=
      (parser->services_).vec.
      super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    iVar3 = iVar3 + (((*ppSVar2)->super_Definition).generated ^ 1);
  }
  if (iVar3 == 0) {
    bVar1 = true;
  }
  else {
    GoGRPCGenerator::GoGRPCGenerator(&local_a0,parser,path,file_name);
    bVar1 = GoGRPCGenerator::generate(&local_a0);
    BaseGenerator::~BaseGenerator(&local_a0.super_BaseGenerator);
  }
  return bVar1;
}

Assistant:

bool GenerateGoGRPC(const Parser &parser, const std::string &path,
                    const std::string &file_name) {
  int nservices = 0;
  for (auto it = parser.services_.vec.begin(); it != parser.services_.vec.end();
       ++it) {
    if (!(*it)->generated) nservices++;
  }
  if (!nservices) return true;
  return GoGRPCGenerator(parser, path, file_name).generate();
}